

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool CountHighbitsCollisions<Blob<128>>
               (vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes,int nbHBits)

{
  bool bVar1;
  size_type sVar2;
  uint in_ESI;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_RDI;
  double dVar3;
  Blob<128> h2;
  Blob<128> h1;
  size_t hnb;
  int collcount;
  double expected;
  size_t nbH;
  int shiftBy;
  int origBits;
  int in_stack_ffffffffffffffa4;
  Blob<128> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  ulong local_40;
  uint local_34;
  bool local_1;
  
  if ((int)(0x80 - in_ESI) < 1) {
    local_1 = true;
  }
  else {
    sVar2 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(in_RDI);
    dVar3 = EstimateNbCollisions(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",dVar3,(ulong)in_ESI);
    local_34 = 0;
    for (local_40 = 1; local_40 < sVar2; local_40 = local_40 + 1) {
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](in_RDI,local_40 - 1);
      Blob<128>::operator>>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](in_RDI,local_40);
      Blob<128>::operator>>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      bVar1 = Blob<128>::operator==
                        ((Blob<128> *)&stack0xffffffffffffffb0,(Blob<128> *)&stack0xffffffffffffffa0
                        );
      if (bVar1) {
        local_34 = local_34 + 1;
      }
    }
    printf("actual %6i (%.2fx)",(double)(int)local_34 / dVar3,(ulong)local_34);
    if ((0.98 < (double)(int)local_34 / dVar3) && (local_34 != (int)dVar3)) {
      printf(" (%i)",(ulong)(local_34 - (int)dVar3));
    }
    if ((double)(int)local_34 / dVar3 <= 2.0) {
      printf("\n");
      local_1 = true;
    }
    else {
      printf(" !!!!!\n");
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
#ifdef DEBUG
    hashtype const h1x = hashes[hnb-1];
    hashtype const h2x = hashes[hnb];
#endif
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
      collcount++;
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}